

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O2

bool __thiscall RTIMUMPU9250::bypassOff(RTIMUMPU9250 *this)

{
  bool bVar1;
  uchar userControl;
  
  bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'j',
                            '\x01',&userControl,"Failed to read user_ctrl reg");
  if (bVar1) {
    userControl = userControl | 0x20;
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               'j','\x01',&userControl,"Failed to write user_ctrl reg");
    if (bVar1) {
      RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,0x32);
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr
                                 ,'7',0x80,"Failed to write int_pin_cfg reg");
      if (bVar1) {
        RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,0x32);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUMPU9250::bypassOff()
{
    unsigned char userControl;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_USER_CTRL, 1, &userControl, "Failed to read user_ctrl reg"))
        return false;

    userControl |= 0x20;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_USER_CTRL, 1, &userControl, "Failed to write user_ctrl reg"))
        return false;

    m_settings->delayMs(50);

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_INT_PIN_CFG, 0x80, "Failed to write int_pin_cfg reg"))
         return false;

    m_settings->delayMs(50);
    return true;
}